

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c352.c
# Opt level: O1

void c352_w(void *chip,UINT16 address,UINT16 val)

{
  long lVar1;
  ushort uVar2;
  undefined4 uVar3;
  undefined6 in_register_00000032;
  long lVar4;
  C352 *c;
  UINT16 *pUVar5;
  
  if ((uint)CONCAT62(in_register_00000032,address) < 0x100) {
    pUVar5 = (UINT16 *)
             ((long)chip + (ulong)C352RegMap[address & 7] * 2 + (ulong)(address >> 3) * 0x24 + 0xc);
  }
  else {
    if (address != 0x200) {
      if (address == 0x202) {
        lVar1 = 0;
        do {
          uVar2 = *(ushort *)((long)chip + lVar1 + 0x22);
          if ((uVar2 >> 0xe & 1) == 0) {
            if ((uVar2 >> 0xd & 1) != 0) {
              uVar2 = uVar2 & 0x1fff;
              uVar3 = 0xffff;
              lVar4 = 4;
              goto LAB_0016affd;
            }
          }
          else {
            *(uint *)((long)chip + lVar1 + 0xc) =
                 (uint)*(ushort *)((long)chip + lVar1 + 0x26) |
                 *(int *)((long)chip + lVar1 + 0x24) << 0x10;
            *(undefined8 *)((long)chip + lVar1 + 0x10) = 0xffff;
            uVar2 = uVar2 & 0x37ff | 0x8000;
            uVar3 = 0;
            lVar4 = 0x10;
LAB_0016affd:
            *(ushort *)((long)chip + lVar1 + 0x22) = uVar2;
            *(undefined4 *)((long)chip + lVar4 + lVar1 + 0xc) = uVar3;
          }
          lVar1 = lVar1 + 0x24;
        } while (lVar1 != 0x480);
      }
      return;
    }
    pUVar5 = (UINT16 *)((long)chip + 0x48e);
  }
  *pUVar5 = val;
  return;
}

Assistant:

static void c352_w(void *chip, UINT16 address, UINT16 val)
{
	C352 *c = (C352 *)chip;
	
	int i;
	
	if(address < 0x100) // Channel registers, see map above.
	{
		*((UINT16*)&c->v[address/8]+C352RegMap[address%8]) = val;
	}
	else if(address == 0x200)
	{
		c->control = val;
		//logerror("C352 control register write: %04x\n",val);
	}
	else if(address == 0x202) // execute keyons/keyoffs
	{
		for(i=0;i<C352_VOICES;i++)
		{
			if((c->v[i].flags & C352_FLG_KEYON))
			{
				c->v[i].pos = (c->v[i].wave_bank<<16) | c->v[i].wave_start;

				c->v[i].sample = 0;
				c->v[i].last_sample = 0;
				c->v[i].counter = 0xffff;

				c->v[i].flags |= C352_FLG_BUSY;
				c->v[i].flags &= ~(C352_FLG_KEYON|C352_FLG_LOOPHIST);

				c->v[i].curr_vol[0] = c->v[i].curr_vol[1] = 0;
				c->v[i].curr_vol[2] = c->v[i].curr_vol[3] = 0;
			}
			else if(c->v[i].flags & C352_FLG_KEYOFF)
			{
				c->v[i].flags &= ~(C352_FLG_BUSY|C352_FLG_KEYOFF);
				c->v[i].counter = 0xffff;
			}
		}
	}
}